

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

char * __thiscall xe::TestResultParser::getAttribute(TestResultParser *this,char *name)

{
  bool bVar1;
  char *pcVar2;
  TestResultParseError *this_00;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,name);
  if (bVar1) {
    pcVar2 = xml::Parser::getAttribute(&this->m_xmlParser,name);
    return pcVar2;
  }
  this_00 = (TestResultParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Missing attribute \'",&local_c1);
  std::operator+(&local_a0,&local_c0,name);
  std::operator+(&local_80,&local_a0,"\' in <");
  std::operator+(&local_60,&local_80,(this->m_xmlParser).m_elementName._M_dataplus._M_p);
  std::operator+(&local_40,&local_60,">");
  TestResultParseError::TestResultParseError(this_00,&local_40);
  __cxa_throw(this_00,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const char* TestResultParser::getAttribute (const char* name)
{
	if (!m_xmlParser.hasAttribute(name))
		throw TestResultParseError(string("Missing attribute '") + name + "' in <" + m_xmlParser.getElementName() + ">");

	return m_xmlParser.getAttribute(name);
}